

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall
TApp_HelpFlagFromDefaultsSubcommands_Test::TestBody(TApp_HelpFlagFromDefaultsSubcommands_Test *this)

{
  App *pAVar1;
  char *pcVar2;
  AssertHelper local_d0;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"--that",(allocator *)&gtest_ar_1);
  std::__cxx11::string::string((string *)&local_58,"Wow",(allocator *)&gtest_ar);
  pAVar1 = &(this->super_TApp).app;
  CLI::App::set_help_flag(pAVar1,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_78,"app2",(allocator *)&gtest_ar_1);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&local_98,"",(allocator *)&gtest_ar);
  pAVar1 = CLI::App::add_subcommand(pAVar1,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  CLI::Option::get_name_abi_cxx11_((string *)&gtest_ar_1,pAVar1->help_ptr_,false);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            ((internal *)&gtest_ar,"app2->get_help_ptr()->get_name()","\"--that\"",
             (string *)&gtest_ar_1,(char (*) [7])"--that");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x14a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar_1,"app2->get_help_ptr()->get_description()","\"Wow\"",
             &pAVar1->help_ptr_->description_,(char (*) [4])"Wow");
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x14b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  return;
}

Assistant:

TEST_F(TApp, HelpFlagFromDefaultsSubcommands) {
    app.set_help_flag("--that", "Wow");

    auto app2 = app.add_subcommand("app2");

    EXPECT_EQ(app2->get_help_ptr()->get_name(), "--that");
    EXPECT_EQ(app2->get_help_ptr()->get_description(), "Wow");
}